

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::LoadFile(XMLDocument *this,char *filename)

{
  FILE *__stream;
  FILE *fp;
  char *filename_local;
  XMLDocument *this_local;
  
  Clear(this);
  __stream = (FILE *)callfopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    SetError(this,XML_ERROR_FILE_NOT_FOUND,filename,(char *)0x0);
    this_local._4_4_ = this->_errorID;
  }
  else {
    LoadFile(this,(FILE *)__stream);
    fclose(__stream);
    this_local._4_4_ = this->_errorID;
  }
  return this_local._4_4_;
}

Assistant:

XMLError XMLDocument::LoadFile( const char* filename )
{
    Clear();
    FILE* fp = callfopen( filename, "rb" );
    if ( !fp ) {
        SetError( XML_ERROR_FILE_NOT_FOUND, filename, 0 );
        return _errorID;
    }
    LoadFile( fp );
    fclose( fp );
    return _errorID;
}